

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  size_t sVar1;
  pointer pbVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  
  this->m_suffix = false;
  sVar7 = this->m_column->m_width;
  sVar6 = indent(this);
  sVar1 = this->m_pos;
  this->m_end = sVar1;
  pbVar2 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pbVar2[this->m_stringIndex]._M_dataplus;
  sVar8 = sVar1;
  if (*(char *)(lVar3 + sVar1) == '\n') {
    sVar8 = sVar1 + 1;
    this->m_end = sVar8;
  }
  sVar7 = sVar7 - sVar6;
  uVar4 = *(size_type *)((long)(pbVar2 + this->m_stringIndex) + 8);
  while ((sVar8 < uVar4 && (*(char *)(lVar3 + sVar8) != '\n'))) {
    sVar8 = sVar8 + 1;
    this->m_end = sVar8;
  }
  sVar6 = sVar7;
  if (sVar8 < sVar1 + sVar7) {
    sVar8 = sVar8 - sVar1;
  }
  else {
    do {
      sVar1 = sVar6;
      if (sVar6 == 0) break;
      bVar5 = isBoundary(this,this->m_pos + sVar6);
      sVar6 = sVar6 - 1;
    } while (!bVar5);
    do {
      sVar8 = sVar1;
      if (sVar8 == 0) {
        this->m_suffix = true;
        sVar8 = sVar7 - 1;
        break;
      }
      bVar5 = isWhitespace(*(char *)((sVar8 - 1) +
                                    *(long *)&(this->m_column->m_strings).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [this->m_stringIndex]._M_dataplus + this->m_pos));
      sVar1 = sVar8 - 1;
    } while (bVar5);
  }
  this->m_len = sVar8;
  return;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			if (line()[m_pos] == '\n') {
				++m_end;
			}
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}